

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_pipe_close(void *arg)

{
  ipc_pipe *p;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x608));
  *(undefined1 *)((long)arg + 0x18) = 1;
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x608));
  nni_aio_close((nni_aio *)((long)arg + 0x270));
  nni_aio_close((nni_aio *)((long)arg + 0xa8));
  nni_aio_close((nni_aio *)((long)arg + 0x438));
  nng_stream_close(*arg);
  return;
}

Assistant:

static void
ipc_pipe_close(void *arg)
{
	ipc_pipe *p = arg;

	nni_mtx_lock(&p->mtx);
	p->closed = true;
	nni_mtx_unlock(&p->mtx);

	nni_aio_close(&p->rx_aio);
	nni_aio_close(&p->tx_aio);
	nni_aio_close(&p->neg_aio);

	nng_stream_close(p->conn);
}